

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_File_open(MPIABI_Comm comm,char *filename,int amode,MPIABI_Info info,MPIABI_File *fh)

{
  char *pcVar1;
  int iVar2;
  ompi_communicator_t *poVar3;
  ompi_info_t *poVar4;
  ompi_file_t **ppoVar5;
  WPI_HandlePtr<ompi_file_t_*> local_48;
  WPI_Handle local_40 [8];
  WPI_Handle local_38 [8];
  MPIABI_File *local_30;
  MPIABI_File *fh_local;
  MPIABI_Info info_local;
  char *pcStack_18;
  int amode_local;
  char *filename_local;
  MPIABI_Comm comm_local;
  
  local_30 = fh;
  fh_local = (MPIABI_File *)info;
  info_local._4_4_ = amode;
  pcStack_18 = filename;
  filename_local = (char *)comm;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_38,comm);
  poVar3 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_38);
  pcVar1 = pcStack_18;
  iVar2 = info_local._4_4_;
  WPI_Handle<ompi_info_t_*>::WPI_Handle((WPI_Handle<ompi_info_t_*> *)local_40,(uintptr_t)fh_local);
  poVar4 = WPI_Handle::operator_cast_to_ompi_info_t_(local_40);
  WPI_HandlePtr<ompi_file_t_*>::WPI_HandlePtr(&local_48,local_30);
  ppoVar5 = WPI_HandlePtr::operator_cast_to_ompi_file_t__((WPI_HandlePtr *)&local_48);
  iVar2 = MPI_File_open(poVar3,pcVar1,iVar2,poVar4,ppoVar5);
  WPI_HandlePtr<ompi_file_t_*>::~WPI_HandlePtr(&local_48);
  return iVar2;
}

Assistant:

int MPIABI_File_open(
  MPIABI_Comm comm,
  const char * filename,
  int amode,
  MPIABI_Info info,
  MPIABI_File * fh
) {
  return MPI_File_open(
    (MPI_Comm)(WPI_Comm)comm,
    filename,
    amode,
    (MPI_Info)(WPI_Info)info,
    (MPI_File *)(WPI_FilePtr)fh
  );
}